

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::compiler::Compiler::Node::Content_&> __thiscall
capnp::compiler::Compiler::Node::getContent(Node *this,State minimumState)

{
  Content *pCVar1;
  ushort uVar2;
  State SVar3;
  Impl *pIVar4;
  CompiledModule *params_1;
  Node *pNVar5;
  Node **ppNVar6;
  undefined4 uVar7;
  int iVar8;
  NodeTranslator *pNVar9;
  long *ptr;
  Exception *params_1_00;
  Node **ppNVar10;
  char c;
  Arena *pAVar11;
  ArrayPtr<const_char> AVar12;
  Reader value;
  StringPtr error;
  StringPtr error_00;
  Fault f;
  Own<capnp::compiler::Compiler::Node> local_3b8 [2];
  Own<capnp::compiler::Compiler::Alias> alias;
  Orphan<capnp::schema::Node> schemaNode;
  Own<capnp::compiler::Compiler::Node> subNode;
  IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
  local_300;
  NullableValue<kj::Exception> exception;
  Reader nestedDecl;
  
  if (this->isBuiltin == true) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
              ((Fault *)&exception,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
               ,0x1ce,FAILED,"!isBuiltin","\"illegal method call for built-in declaration\"",
               (char (*) [45])"illegal method call for built-in declaration");
    kj::_::Debug::Fault::fatal((Fault *)&exception);
  }
  pCVar1 = &this->guardedContent;
  SVar3 = (this->guardedContent).state;
  if ((int)minimumState <= (int)SVar3) {
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)pCVar1;
  }
  if (this->inGetContent == true) {
    error.content.size_ = 0x2b;
    error.content.ptr = "Declaration recursively depends on itself.";
    addError(this,error);
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)(Content *)0x0;
  }
  this->inGetContent = true;
  if (SVar3 != BOOTSTRAP) {
    if (SVar3 != EXPANDED) {
      if ((SVar3 != STUB) || ((int)minimumState < 1)) goto LAB_00475ac1;
      pIVar4 = this->module->compiler;
      Declaration::Reader::getNestedDecls((Reader *)&exception,&this->declaration);
      uVar7 = exception.field_1._16_4_;
      pAVar11 = &pIVar4->nodeArena;
      schemaNode.builder.tag.content = (uint64_t)&exception;
      for (schemaNode.builder.segment._0_4_ = 0; (int)schemaNode.builder.segment != uVar7;
          schemaNode.builder.segment._0_4_ = (int)schemaNode.builder.segment + 1) {
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
        ::operator*(&nestedDecl,
                    (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                     *)&schemaNode);
        if (nestedDecl._reader.dataSize < 0x20) {
LAB_004755ab:
          kj::Arena::
          allocateOwn<capnp::compiler::Compiler::Node,capnp::compiler::Compiler::Node&,capnp::compiler::Declaration::Reader&>
                    ((Arena *)&subNode,(Node *)pAVar11,(Reader *)this);
          Declaration::Reader::getName((Reader *)&f,&nestedDecl);
          AVar12 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)&f);
          kj::Vector<capnp::compiler::Compiler::Node*>::
          add<kj::Own<capnp::compiler::Compiler::Node>&>
                    ((Vector<capnp::compiler::Compiler::Node*> *)
                     &(this->guardedContent).orderedNestedNodes,&subNode);
          local_3b8[0].disposer = subNode.disposer;
          local_3b8[0].ptr = subNode.ptr;
          subNode.ptr = (Node *)0x0;
          _f = AVar12;
          std::
          _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>>
          ::_M_emplace_equal<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Node>>>
                    ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>>
                      *)&(this->guardedContent).nestedNodes,
                     (pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_> *)&f);
          kj::Own<capnp::compiler::Compiler::Node>::dispose(local_3b8);
          kj::Own<capnp::compiler::Compiler::Node>::dispose(&subNode);
        }
        else {
          uVar2 = *(ushort *)((long)nestedDecl._reader.data + 2);
          if (0xd < uVar2) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,char_const(&)[25],capnp::compiler::Declaration::Reader&>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                       ,0x205,FAILED,(char *)0x0,"\"unknown declaration type\", nestedDecl",
                       (char (*) [25])"unknown declaration type",&nestedDecl);
            kj::_::Debug::Fault::fatal(&f);
          }
          if ((0x35d0U >> (uVar2 & 0x1f) & 1) == 0) {
            if ((0xa2dU >> (uVar2 & 0x1f) & 1) != 0) goto LAB_004755ab;
            params_1 = this->module;
            subNode.disposer = (Disposer *)nestedDecl._reader.segment;
            subNode.ptr = (Node *)nestedDecl._reader.capTable;
            Declaration::Using::Reader::getTarget((Reader *)&f,(Reader *)&subNode);
            kj::Arena::
            allocateOwn<capnp::compiler::Compiler::Alias,capnp::compiler::Compiler::CompiledModule&,capnp::compiler::Compiler::Node&,capnp::compiler::Expression::Reader>
                      ((Arena *)&alias,(CompiledModule *)pAVar11,(Node *)params_1,(Reader *)this);
            Declaration::Reader::getName((Reader *)&f,&nestedDecl);
            _f = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)&f);
            local_3b8[0].disposer = alias.disposer;
            local_3b8[0].ptr = (Node *)alias.ptr;
            alias.ptr = (Alias *)0x0;
            std::
            _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>>
            ::_M_emplace_equal<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Alias>>>
                      ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>>
                        *)&(this->guardedContent).aliases,
                       (pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_> *)&f);
            if (local_3b8[0].ptr != (Node *)0x0) {
              local_3b8[0].ptr = (Node *)0x0;
              (**(local_3b8[0].disposer)->_vptr_Disposer)();
            }
            if (alias.ptr != (Alias *)0x0) {
              alias.ptr = (Alias *)0x0;
              (**(alias.disposer)->_vptr_Disposer)();
            }
          }
        }
      }
      pCVar1->state = EXPANDED;
    }
    if ((int)minimumState < 2) goto LAB_00475ac1;
    pIVar4 = this->module->compiler;
    Orphanage::newOrphan<capnp::schema::Node>(&schemaNode,&(pIVar4->workspace).orphanage);
    capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::apply
              ((Builder *)&f,&schemaNode.builder);
    (local_3b8[0].disposer)->_vptr_Disposer = (_func_int **)this->id;
    capnp::schema::Node::Builder::setDisplayName((Builder *)&f,(Reader)(this->displayName).content);
    c = (char)this + 'P';
    kj::StringPtr::findLast((StringPtr *)&exception,c);
    if (exception.isSet == true) {
      *(int *)&local_3b8[0].disposer[1]._vptr_Disposer = exception.field_1._0_4_ + 1;
    }
    kj::StringPtr::findLast((StringPtr *)&exception,c);
    if ((exception.isSet == true) &&
       ((ulong)*(uint *)&local_3b8[0].disposer[1]._vptr_Disposer <
        CONCAT44(exception.field_1._4_4_,exception.field_1._0_4_))) {
      *(int *)&local_3b8[0].disposer[1]._vptr_Disposer = exception.field_1._0_4_ + 1;
    }
    pNVar5 = (this->parent).ptr;
    if (pNVar5 != (Node *)0x0) {
      local_3b8[0].disposer[2]._vptr_Disposer = (_func_int **)pNVar5->id;
    }
    capnp::schema::Node::Builder::initNestedNodes
              ((Builder *)&subNode,(Builder *)&f,
               (uint)((ulong)((long)(this->guardedContent).orderedNestedNodes.builder.pos -
                             (long)(this->guardedContent).orderedNestedNodes.builder.ptr) >> 3));
    local_300.index = 0;
    ppNVar6 = (this->guardedContent).orderedNestedNodes.builder.pos;
    local_300.container = (Builder *)&subNode;
    for (ppNVar10 = (this->guardedContent).orderedNestedNodes.builder.ptr; ppNVar10 != ppNVar6;
        ppNVar10 = ppNVar10 + 1) {
      pNVar5 = *ppNVar10;
      capnp::_::
      IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
      ::operator->((TemporaryPointer<capnp::schema::Node::NestedNode::Builder> *)&nestedDecl,
                   &local_300);
      Declaration::Reader::getName((Reader *)&exception,&pNVar5->declaration);
      value = LocatedText::Reader::getValue((Reader *)&exception);
      capnp::schema::Node::NestedNode::Builder::setName((Builder *)&nestedDecl,value);
      capnp::_::
      IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
      ::operator->((TemporaryPointer<capnp::schema::Node::NestedNode::Builder> *)&exception,
                   &local_300);
      *(uint64_t *)exception.field_1.value.ownFile.content.size_ = pNVar5->id;
      local_300.index = local_300.index + 1;
    }
    pAVar11 = &(pIVar4->workspace).arena;
    params_1_00 = (Exception *)&this->declaration;
    exception.isSet = this->module->compiler->annotationFlag == COMPILE_ANNOTATIONS;
    pNVar9 = kj::Arena::
             allocate<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
                       (pAVar11,this,&this->module->parserModule->super_ErrorReporter,
                        (Reader *)params_1_00,&schemaNode,&exception.isSet);
    (this->guardedContent).translator = pNVar9;
    alias.disposer = (Disposer *)&PTR_run_00676740;
    alias.ptr = (Alias *)pCVar1;
    kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&nestedDecl,(Runnable *)&alias);
    kj::_::NullableValue<kj::Exception>::NullableValue
              (&exception,(NullableValue<kj::Exception> *)&nestedDecl);
    kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&nestedDecl)
    ;
    if (exception.isSet == true) {
      if ((this->guardedContent).bootstrapSchema.ptr.isSet == true) {
        (this->guardedContent).bootstrapSchema.ptr.isSet = false;
      }
      iVar8 = (*(this->module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[1])();
      if ((char)iVar8 == '\0') {
        kj::str<char_const(&)[60],kj::Exception&>
                  ((String *)&nestedDecl,
                   (kj *)"Internal compiler bug: Bootstrap schema failed validation:\n",
                   (char (*) [60])&exception.field_1,params_1_00);
        if (nestedDecl._reader.capTable == (CapTableReader *)0x0) {
          nestedDecl._reader.segment = (SegmentReader *)0x514074;
        }
        error_00.content.size_ =
             (long)&(nestedDecl._reader.capTable)->_vptr_CapTableReader +
             (ulong)(nestedDecl._reader.capTable == (CapTableReader *)0x0);
        error_00.content.ptr = (char *)nestedDecl._reader.segment;
        addError(this,error_00);
        kj::Array<char>::~Array((Array<char> *)&nestedDecl);
      }
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue(&exception);
    exception.field_1._0_4_ = exception.field_1._0_4_ & 0xffffff00;
    exception._0_8_ = pCVar1;
    ptr = (long *)kj::Arena::allocateBytes(pAVar11,0x10,8,true);
    *ptr = (long)pCVar1;
    *(undefined1 *)(ptr + 1) = 0;
    exception.field_1._0_1_ = 1;
    kj::Arena::setDestructor
              (pAVar11,ptr,
               kj::Arena::
               destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
              );
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++:578:38)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:578:38)>
                 *)&exception);
    pCVar1->state = BOOTSTRAP;
    capnp::_::OrphanBuilder::~OrphanBuilder(&schemaNode.builder);
  }
  if (2 < (int)minimumState) {
    NodeTranslator::finish((NodeSet *)&exception,(this->guardedContent).translator);
    if ((this->guardedContent).finalSchema.ptr.isSet == true) {
      (this->guardedContent).finalSchema.ptr.isSet = false;
    }
    *(char **)&(this->guardedContent).finalSchema.ptr.field_1.value._reader.dataSize =
         exception.field_1.value.file;
    *(undefined8 *)&(this->guardedContent).finalSchema.ptr.field_1.value._reader.nestingLimit =
         exception.field_1._32_8_;
    (this->guardedContent).finalSchema.ptr.field_1.value._reader.data =
         (void *)exception.field_1.value.ownFile.content.size_;
    (this->guardedContent).finalSchema.ptr.field_1.value._reader.pointers =
         (WirePointer *)CONCAT44(exception.field_1._20_4_,exception.field_1._16_4_);
    (this->guardedContent).finalSchema.ptr.field_1.value._reader.segment =
         (SegmentReader *)exception._0_8_;
    (this->guardedContent).finalSchema.ptr.field_1.value._reader.capTable =
         (CapTableReader *)CONCAT44(exception.field_1._4_4_,exception.field_1._0_4_);
    (this->guardedContent).finalSchema.ptr.isSet = true;
    kj::Array<capnp::schema::Node::Reader>::operator=
              (&(this->guardedContent).auxSchemas,
               (Array<capnp::schema::Node::Reader> *)&exception.field_1.value.description);
    kj::Array<capnp::schema::Node::SourceInfo::Reader>::operator=
              (&(this->guardedContent).sourceInfo,
               (Array<capnp::schema::Node::SourceInfo::Reader> *)&exception.field_1.value.context);
    pCVar1->state = FINISHED;
    NodeTranslator::NodeSet::~NodeSet((NodeSet *)&exception);
  }
LAB_00475ac1:
  this->inGetContent = false;
  return (Maybe<capnp::compiler::Compiler::Node::Content_&>)pCVar1;
}

Assistant:

kj::Maybe<Compiler::Node::Content&> Compiler::Node::getContent(Content::State minimumState) {
  KJ_REQUIRE(!isBuiltin, "illegal method call for built-in declaration");

  auto& content = guardedContent;

  if (content.stateHasReached(minimumState)) {
    return content;
  }

  if (inGetContent) {
    addError("Declaration recursively depends on itself.");
    return nullptr;
  }

  inGetContent = true;
  KJ_DEFER(inGetContent = false);

  switch (content.state) {
    case Content::STUB: {
      if (minimumState <= Content::STUB) break;

      // Expand the child nodes.
      auto& arena = module->getCompiler().getNodeArena();

      for (auto nestedDecl: declaration.getNestedDecls()) {
        switch (nestedDecl.which()) {
          case Declaration::FILE:
          case Declaration::CONST:
          case Declaration::ANNOTATION:
          case Declaration::ENUM:
          case Declaration::STRUCT:
          case Declaration::INTERFACE: {
            kj::Own<Node> subNode = arena.allocateOwn<Node>(*this, nestedDecl);
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.orderedNestedNodes.add(subNode);
            content.nestedNodes.insert(std::make_pair(name, kj::mv(subNode)));
            break;
          }

          case Declaration::USING: {
            kj::Own<Alias> alias = arena.allocateOwn<Alias>(
                *module, *this, nestedDecl.getUsing().getTarget());
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.aliases.insert(std::make_pair(name, kj::mv(alias)));
            break;
          }
          case Declaration::ENUMERANT:
          case Declaration::FIELD:
          case Declaration::UNION:
          case Declaration::GROUP:
          case Declaration::METHOD:
          case Declaration::NAKED_ID:
          case Declaration::NAKED_ANNOTATION:
            // Not a node.  Skip.
            break;
          default:
            KJ_FAIL_ASSERT("unknown declaration type", nestedDecl);
            break;
        }
      }

      content.advanceState(Content::EXPANDED);
    } // fallthrough

    case Content::EXPANDED: {
      if (minimumState <= Content::EXPANDED) break;

      // Construct the NodeTranslator.
      auto& workspace = module->getCompiler().getWorkspace();

      auto schemaNode = workspace.orphanage.newOrphan<schema::Node>();
      auto builder = schemaNode.get();
      builder.setId(id);
      builder.setDisplayName(displayName);
      // TODO(cleanup):  Would be better if we could remember the prefix length from before we
      //   added this decl's name to the end.
      KJ_IF_MAYBE(lastDot, displayName.findLast('.')) {
        builder.setDisplayNamePrefixLength(*lastDot + 1);
      }
      KJ_IF_MAYBE(lastColon, displayName.findLast(':')) {
        if (*lastColon > builder.getDisplayNamePrefixLength()) {
          builder.setDisplayNamePrefixLength(*lastColon + 1);
        }
      }
      KJ_IF_MAYBE(p, parent) {
        builder.setScopeId(p->id);
      }

      auto nestedNodes = builder.initNestedNodes(content.orderedNestedNodes.size());
      auto nestedIter = nestedNodes.begin();
      for (auto node: content.orderedNestedNodes) {
        nestedIter->setName(node->declaration.getName().getValue());
        nestedIter->setId(node->id);
        ++nestedIter;
      }

      content.translator = &workspace.arena.allocate<NodeTranslator>(
          *this, module->getErrorReporter(), declaration, kj::mv(schemaNode),
          module->getCompiler().shouldCompileAnnotations());
      KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&](){
        auto nodeSet = content.translator->getBootstrapNode();
        for (auto& auxNode: nodeSet.auxNodes) {
          workspace.bootstrapLoader.loadOnce(auxNode);
        }
        content.bootstrapSchema = workspace.bootstrapLoader.loadOnce(nodeSet.node);
      })) {
        content.bootstrapSchema = nullptr;
        // Only bother to report validation failures if we think we haven't seen any errors.
        // Otherwise we assume that the errors caused the validation failure.
        if (!module->getErrorReporter().hadErrors()) {
          addError(kj::str("Internal compiler bug: Bootstrap schema failed validation:\n",
                           *exception));
        }
      }

      // If the Workspace is destroyed, revert the node to the EXPANDED state, because the
      // NodeTranslator is no longer valid in this case.
      workspace.arena.copy(kj::defer([&content]() {
        content.bootstrapSchema = nullptr;
        if (content.state > Content::EXPANDED) {
          content.state = Content::EXPANDED;
        }
      }));

      content.advanceState(Content::BOOTSTRAP);
    } // fallthrough

    case Content::BOOTSTRAP: {
      if (minimumState <= Content::BOOTSTRAP) break;

      // Create the final schema.
      auto nodeSet = content.translator->finish();
      content.finalSchema = nodeSet.node;
      content.auxSchemas = kj::mv(nodeSet.auxNodes);
      content.sourceInfo = kj::mv(nodeSet.sourceInfo);

      content.advanceState(Content::FINISHED);
    } // fallthrough

    case Content::FINISHED:
      break;
  }

  return content;
}